

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

int __thiscall Directory::remove(Directory *this,char *__filename)

{
  int iVar1;
  char *__filename_00;
  undefined8 uVar2;
  string fullPath;
  Directory *in_stack_000000c8;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar3;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [32];
  string local_30 [32];
  char *local_10;
  Directory *local_8;
  
  local_10 = __filename;
  local_8 = this;
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff87,
                          CONCAT16(in_stack_ffffffffffffff86,
                                   CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80))));
  std::__cxx11::string::~string(local_50);
  __filename_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::remove(__filename_00);
  uVar3 = false;
  if (iVar1 == 0) {
    uVar3 = refresh(in_stack_000000c8);
  }
  uVar2 = std::__cxx11::string::~string(local_30);
  return (uint)CONCAT71((int7)((ulong)uVar2 >> 8),uVar3) & 0xffffff01;
}

Assistant:

bool Directory::remove(std::string name)
{
	std::string fullPath = path + OS_PATHSEP + name;

#ifndef _WIN32
	return (!::remove(fullPath.c_str()) && refresh());
#else
	return (!_unlink(fullPath.c_str()) && refresh());
#endif
}